

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::~TaskSet(TaskSet *this)

{
  Own<kj::PromiseFulfiller<void>_>::dispose(&(this->emptyFulfiller).ptr);
  Own<kj::TaskSet::Task>::dispose(&(this->tasks).ptr);
  return;
}

Assistant:

TaskSet::~TaskSet() noexcept(false) {}